

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

int Lodtalk::Object::stIdentityHash(InterpreterProxy *interpreter)

{
  int iVar1;
  
  (*interpreter->_vptr_InterpreterProxy[0xb])();
  iVar1 = identityHashOf((Oop)0x14c322);
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x15])(interpreter,(long)iVar1);
  return iVar1;
}

Assistant:

int Object::stIdentityHash(InterpreterProxy *interpreter)
{
    auto receiver = interpreter->getReceiver();
    return interpreter->returnSmallInteger(identityHashOf(receiver));
}